

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::Merge(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined1 local_158 [8];
  ParserImpl parser;
  Descriptor *root_message_type;
  
  iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[0x13])(output);
  root_message_type = (Descriptor *)CONCAT44(extraout_var,iVar2);
  parser._256_8_ = ZEXT18(this->allow_case_insensitive_field_);
  ParserImpl::ParserImpl
            ((ParserImpl *)local_158,root_message_type,input,this->error_collector_,this->finder_,
             this->parse_info_tree_,ALLOW_SINGULAR_OVERWRITES,this->allow_case_insensitive_field_,
             this->allow_unknown_field_,this->allow_unknown_extension_,this->allow_unknown_enum_,
             this->allow_field_number_,this->allow_relaxed_whitespace_,this->allow_partial_,
             this->recursion_limit_);
  bVar1 = MergeUsingImpl(this,(ZeroCopyInputStream *)root_message_type,output,
                         (ParserImpl *)local_158);
  io::Tokenizer::~Tokenizer((Tokenizer *)&parser.tokenizer_error_collector_.parser_);
  io::ErrorCollector::~ErrorCollector((ErrorCollector *)&parser.parse_info_tree_);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::Merge(io::ZeroCopyInputStream* input,
                               Message* output) {
  ParserImpl parser(output->GetDescriptor(), input, error_collector_, finder_,
                    parse_info_tree_, ParserImpl::ALLOW_SINGULAR_OVERWRITES,
                    allow_case_insensitive_field_, allow_unknown_field_,
                    allow_unknown_extension_, allow_unknown_enum_,
                    allow_field_number_, allow_relaxed_whitespace_,
                    allow_partial_, recursion_limit_);
  return MergeUsingImpl(input, output, &parser);
}